

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O3

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::SubTypes::getSubTypes
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          SubTypes *this,HeapType type)

{
  iterator __position;
  HeapType local_20;
  HeapType type_local;
  
  local_20.id = type.id;
  getStrictSubTypes(__return_storage_ptr__,this,type);
  __position._M_current =
       (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
    _M_realloc_insert<wasm::HeapType_const&>
              ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)__return_storage_ptr__,
               __position,&local_20);
  }
  else {
    (__position._M_current)->id = type.id;
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> getSubTypes(HeapType type) {
    auto ret = getStrictSubTypes(type);
    ret.push_back(type);
    return ret;
  }